

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_int>::FastPForImpl
          (FastPForImpl<8U,_unsigned_int> *this,uint32_t ps)

{
  uint32_t uVar1;
  uint32_t in_ESI;
  uint32_t *in_RDI;
  allocator_type *in_stack_ffffffffffffffc0;
  allocator_type *__a;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  allocator_type local_1d [29];
  
  *in_RDI = in_ESI;
  uVar1 = gccbits(*in_RDI);
  in_RDI[1] = uVar1;
  this_00 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)(in_RDI + 2);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x12e4f6);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(this_00,(size_type)in_RDI,in_stack_ffffffffffffffc0);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x12e516);
  __a = local_1d;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12e547);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)in_RDI,__a)
  ;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12e567);
  return;
}

Assistant:

FastPForImpl(uint32_t ps = 65536)
      : PageSize(ps),
        bitsPageSize(gccbits(PageSize)),
        datatobepacked(sizeof(IntType) * 8 + 1),
        bytescontainer(PageSize + 3 * PageSize / BlockSize) {
    assert(ps / BlockSize * BlockSize == ps);
    assert(gccbits(static_cast<uint32_t>(BlockSizeInUnitsOfPackSize * PACKSIZE - 1)) <= 8);
  }